

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

void __thiscall
cubeb_DISABLED_resampler_duplex_Test::TestBody(cubeb_DISABLED_resampler_duplex_Test *this)

{
  uint input_rate;
  uint output_rate;
  uint target_rate;
  uint input_channels;
  long lVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint output_channels;
  
  input_channels = 1;
  do {
    output_channels = 1;
    do {
      lVar3 = 0;
      do {
        input_rate = sample_rates[lVar3];
        lVar2 = 0;
        do {
          output_rate = sample_rates[lVar2];
          lVar1 = 0;
          do {
            target_rate = sample_rates[lVar1];
            uVar5 = 0;
            do {
              uVar4 = (int)uVar5 + 10;
              uVar5 = (ulong)uVar4;
              fprintf(_stderr,
                      "input channels:%d output_channels:%d input_rate:%d output_rate:%d target_rate:%d chunk_ms:%d\n"
                      ,(ulong)input_channels,(ulong)output_channels,(ulong)input_rate,
                      (ulong)output_rate,(ulong)target_rate,uVar5);
              test_resampler_duplex<float>
                        (input_channels,output_channels,input_rate,output_rate,target_rate,
                         (float)(int)uVar4);
            } while (uVar4 < 0x14);
            lVar1 = lVar1 + 1;
          } while (lVar1 != 3);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      output_channels = output_channels + 1;
    } while (output_channels != 3);
    input_channels = input_channels + 1;
  } while (input_channels != 3);
  return;
}

Assistant:

TEST(cubeb, DISABLED_resampler_duplex)
{
  for (uint32_t input_channels = 1; input_channels <= max_channels; input_channels++) {
    for (uint32_t output_channels = 1; output_channels <= max_channels; output_channels++) {
      for (uint32_t source_rate_input = 0; source_rate_input < array_size(sample_rates); source_rate_input++) {
        for (uint32_t source_rate_output = 0; source_rate_output < array_size(sample_rates); source_rate_output++) {
          for (uint32_t dest_rate = 0; dest_rate < array_size(sample_rates); dest_rate++) {
            for (uint32_t chunk_duration = min_chunks; chunk_duration < max_chunks; chunk_duration+=chunk_increment) {
              fprintf(stderr, "input channels:%d output_channels:%d input_rate:%d "
                     "output_rate:%d target_rate:%d chunk_ms:%d\n",
                     input_channels, output_channels,
                     sample_rates[source_rate_input],
                     sample_rates[source_rate_output],
                     sample_rates[dest_rate],
                     chunk_duration);
              test_resampler_duplex<float>(input_channels, output_channels,
                                           sample_rates[source_rate_input],
                                           sample_rates[source_rate_output],
                                           sample_rates[dest_rate],
                                           chunk_duration);
            }
          }
        }
      }
    }
  }
}